

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disjoint_sets.cpp
# Opt level: O1

void __thiscall
geometrycentral::MarkedDisjointSets::merge(MarkedDisjointSets *this,size_t x,size_t y)

{
  pointer puVar1;
  _Bit_type *p_Var2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  ulong uVar7;
  
  sVar3 = find(this,x);
  sVar4 = find(this,y);
  puVar1 = (this->rank).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  sVar6 = sVar4;
  sVar5 = sVar3;
  if (puVar1[sVar4] < puVar1[sVar3]) {
    sVar6 = sVar3;
    sVar5 = sVar4;
  }
  (this->parent).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[sVar5] = sVar6;
  if (puVar1[sVar3] == puVar1[sVar4]) {
    puVar1[sVar4] = puVar1[sVar4] + 1;
  }
  p_Var2 = (this->marked).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
  sVar5 = sVar3 + 0x3f;
  if (-1 < (long)sVar3) {
    sVar5 = sVar3;
  }
  uVar7 = (ulong)((sVar3 & 0x800000000000003f) < 0x8000000000000001);
  if ((p_Var2[((long)sVar5 >> 6) + uVar7 + 0xffffffffffffffff] >> (sVar3 & 0x3f) & 1) == 0) {
    sVar6 = sVar4 + 0x3f;
    if (-1 < (long)sVar4) {
      sVar6 = sVar4;
    }
    if ((p_Var2[((long)sVar6 >> 6) +
                (ulong)((sVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] >>
         (sVar4 & 0x3f) & 1) == 0) {
      return;
    }
  }
  p_Var2[((long)sVar5 >> 6) + uVar7 + 0xffffffffffffffff] =
       p_Var2[((long)sVar5 >> 6) + uVar7 + 0xffffffffffffffff] | 1L << (sVar3 & 0x3f);
  sVar5 = sVar4 + 0x3f;
  if (-1 < (long)sVar4) {
    sVar5 = sVar4;
  }
  p_Var2[((long)sVar5 >> 6) +
         (ulong)((sVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] =
       p_Var2[((long)sVar5 >> 6) +
              (ulong)((sVar4 & 0x800000000000003f) < 0x8000000000000001) + 0xffffffffffffffff] |
       1L << (sVar4 & 0x3f);
  return;
}

Assistant:

void MarkedDisjointSets::merge(size_t x, size_t y) {
  x = find(x);
  y = find(y);

  // Smaller tree becomes a subtree of the larger tree
  if (rank[x] > rank[y])
    parent[y] = x;
  else
    parent[x] = y;

  if (rank[x] == rank[y]) rank[y]++;

  // If either was marked, both are marked
  if (marked[x] || marked[y]) {
    marked[x] = true;
    marked[y] = true;
  }
}